

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::FeatureDescription::MergeFrom
          (FeatureDescription *this,FeatureDescription *from)

{
  void *pvVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *other;
  FeatureType *this_00;
  FeatureType *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/Model.pb.cc"
               ,0x4d0);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  psVar2 = (from->name_).ptr_;
  if ((psVar2->_M_string_length != 0) && (psVar3 = (this->name_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->shortdescription_).ptr_;
  if ((psVar2->_M_string_length != 0) && (psVar3 = (this->shortdescription_).ptr_, psVar3 != psVar2)
     ) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->shortdescription_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  from_00 = from->type_;
  if (from_00 != (FeatureType *)0x0 &&
      from != (FeatureDescription *)&_FeatureDescription_default_instance_) {
    this_00 = this->type_;
    if (this_00 == (FeatureType *)0x0) {
      this_00 = (FeatureType *)operator_new(0x28);
      FeatureType::FeatureType(this_00);
      this->type_ = this_00;
      from_00 = from->type_;
    }
    if (from_00 == (FeatureType *)0x0) {
      from_00 = (FeatureType *)&_FeatureType_default_instance_;
    }
    FeatureType::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void FeatureDescription::MergeFrom(const FeatureDescription& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureDescription)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.name().size() > 0) {

    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.shortdescription().size() > 0) {

    shortdescription_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.shortdescription_);
  }
  if (from.has_type()) {
    mutable_type()->::CoreML::Specification::FeatureType::MergeFrom(from.type());
  }
}